

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O0

ON_ModelComponentReference __thiscall
ONX_Model::AddModelGeometryComponent
          (ONX_Model *this,ON_Object *geometry_object,ON_3dmObjectAttributes *attributes,
          bool bResolveIdAndNameConflicts)

{
  bool bVar1;
  ON_Geometry *pOVar2;
  ON_Object *pOVar3;
  undefined7 in_register_00000009;
  ON_3dmObjectAttributes *src;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  byte in_R8B;
  ON_ModelComponentReference OVar5;
  bool bManageAttributes;
  bool bManageGeometry;
  ON_Object *managed_geometry_object;
  ON_3dmObjectAttributes *managed_attributes;
  undefined1 local_3c [8];
  ON_UUID id;
  bool bResolveIdAndNameConflicts_local;
  ON_3dmObjectAttributes *attributes_local;
  ON_Object *geometry_object_local;
  ONX_Model *this_local;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  
  src = (ON_3dmObjectAttributes *)CONCAT71(in_register_00000009,bResolveIdAndNameConflicts);
  pOVar2 = ON_Geometry::Cast(&attributes->super_ON_Object);
  if (pOVar2 == (ON_Geometry *)0x0) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
               ,0x618,"","Invalid geometry_object parameter.");
    ON_ModelComponentReference::ON_ModelComponentReference
              ((ON_ModelComponentReference *)this,&ON_ModelComponentReference::Empty);
    _Var4._M_pi = extraout_RDX;
  }
  else {
    local_3c._0_4_ = 0;
    local_3c._4_2_ = 0;
    local_3c._6_2_ = 0;
    id._0_8_ = (uchar  [8])0x0;
    if ((src != (ON_3dmObjectAttributes *)0x0) &&
       (bVar1 = ::operator!=(&ON_nil_uuid,&src->m_uuid), bVar1)) {
      bVar1 = ON_ComponentManifest::IdIsAvailable
                        ((ON_ComponentManifest *)(geometry_object + 0x8d),src->m_uuid);
      if (bVar1) {
        local_3c._0_4_ = (src->m_uuid).Data1;
        local_3c._4_2_ = (src->m_uuid).Data2;
        local_3c._6_2_ = (src->m_uuid).Data3;
        id._0_8_ = *(undefined8 *)(src->m_uuid).Data4;
      }
      else if ((in_R8B & 1) == 0) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
                   ,0x623,"","attributes->m_uuid is invalid or in use in this model.");
        ON_ModelComponentReference::ON_ModelComponentReference
                  ((ON_ModelComponentReference *)this,&ON_ModelComponentReference::Empty);
        _Var4._M_pi = extraout_RDX_00;
        goto LAB_005f948e;
      }
    }
    managed_geometry_object = (ON_Object *)0x0;
    pOVar3 = ON_Object::Duplicate(&attributes->super_ON_Object);
    if (src != (ON_3dmObjectAttributes *)0x0) {
      managed_geometry_object = (ON_Object *)::operator_new(0x170);
      ON_3dmObjectAttributes::ON_3dmObjectAttributes
                ((ON_3dmObjectAttributes *)managed_geometry_object,src);
      (((ON_3dmObjectAttributes *)managed_geometry_object)->m_uuid).Data1 = local_3c._0_4_;
      (((ON_3dmObjectAttributes *)managed_geometry_object)->m_uuid).Data2 = local_3c._4_2_;
      (((ON_3dmObjectAttributes *)managed_geometry_object)->m_uuid).Data3 = local_3c._6_2_;
      *(undefined8 *)(((ON_3dmObjectAttributes *)managed_geometry_object)->m_uuid).Data4 = id._0_8_;
    }
    OVar5 = AddModelGeometryComponentForExperts
                      (this,SUB81(geometry_object,0),(ON_Object *)0x1,SUB81(pOVar3,0),
                       (ON_3dmObjectAttributes *)0x1,SUB81(managed_geometry_object,0));
    _Var4._M_pi = OVar5.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
LAB_005f948e:
  OVar5.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  OVar5.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ON_ModelComponentReference)
         OVar5.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ON_ModelComponentReference ONX_Model::AddModelGeometryComponent(
  const class ON_Object* geometry_object,
  const class ON_3dmObjectAttributes* attributes,
  bool bResolveIdAndNameConflicts
  )
{
  if ( nullptr == ON_Geometry::Cast(geometry_object) )
  {
    ON_ERROR("Invalid geometry_object parameter.");
    return ON_ModelComponentReference::Empty;
  }

  ON_UUID id = ON_nil_uuid;
  if (nullptr != attributes && ON_nil_uuid != attributes->m_uuid )
  {
    if (m_manifest.IdIsAvailable(attributes->m_uuid))
      id = attributes->m_uuid;
    else if (false == bResolveIdAndNameConflicts)
    {
      ON_ERROR("attributes->m_uuid is invalid or in use in this model.");
      return ON_ModelComponentReference::Empty;
    }
  }

  ON_3dmObjectAttributes* managed_attributes = nullptr;
  ON_Object* managed_geometry_object = geometry_object->Duplicate();
  if (nullptr != attributes)
  {
    managed_attributes = new ON_3dmObjectAttributes(*attributes);
    managed_attributes->m_uuid = id;
  }

  const bool bManageGeometry = true;
  const bool bManageAttributes = true;
  return AddModelGeometryComponentForExperts(
    bManageGeometry,
    managed_geometry_object,
    bManageAttributes,
    managed_attributes,
    bResolveIdAndNameConflicts
  );
}